

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeRecordCompareWithSkip(int nKey1,void *pKey1,UnpackedRecord *pPKey2,int bSkip)

{
  double dVar1;
  ushort uVar2;
  KeyInfo *pKVar3;
  uint uVar4;
  u8 uVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  undefined4 uVar18;
  uint uVar19;
  Mem *pMem2;
  bool bVar20;
  Mem mem1;
  uint local_9c;
  UnpackedRecord *local_98;
  u8 *local_90;
  double local_88;
  long local_78;
  uint local_6c;
  MemValue local_68;
  undefined2 local_60;
  u8 local_5e;
  uint local_5c;
  long local_58;
  sqlite3 *local_40;
  
  pMem2 = pPKey2->aMem;
  local_98 = pPKey2;
  if (bSkip == 0) {
    if (*pKey1 < 0) {
      bVar6 = sqlite3GetVarint32((uchar *)pKey1,&local_6c);
      uVar13 = (ulong)bVar6;
    }
    else {
      uVar13 = 1;
      local_6c = (int)*pKey1;
    }
    uVar11 = 0;
    uVar15 = local_6c;
    goto LAB_0017779c;
  }
  if (*(char *)((long)pKey1 + 1) < '\0') {
    uVar5 = sqlite3GetVarint32((uchar *)((long)pKey1 + 1),(u32 *)&local_68.nZero);
    uVar13 = (ulong)(byte)(uVar5 + 1);
    bVar6 = *pKey1;
    uVar18 = local_68.nZero;
    if ((uint)local_68.nZero < 0x80) goto LAB_00177781;
    local_6c = local_68.nZero - 0xcU >> 1;
  }
  else {
    bVar6 = *pKey1;
    uVar13 = 2;
    uVar18 = (int)*(char *)((long)pKey1 + 1);
LAB_00177781:
    local_6c = (uint)""[(uint)uVar18];
  }
  local_6c = local_6c + bVar6;
  pMem2 = pMem2 + 1;
  uVar11 = 1;
  uVar15 = (uint)bVar6;
LAB_0017779c:
  if ((uint)nKey1 < local_6c) {
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13b66,
                "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
    local_98->errCode = '\v';
    return 0;
  }
  local_90 = &local_98->errCode;
  uVar19 = local_6c;
  do {
    uVar10 = (ulong)uVar19;
    uVar2 = pMem2->flags;
    if ((uVar2 & 0x24) == 0) {
      if ((uVar2 & 8) == 0) {
        if ((uVar2 & 2) == 0) {
          bVar6 = *(byte *)((long)pKey1 + uVar13);
          uVar12 = (uint)bVar6;
          if ((uVar2 & 0x10) == 0) {
            uVar17 = (uint)(bVar6 != 0);
          }
          else {
            if ((char)bVar6 < '\0') {
              sqlite3GetVarint32((uchar *)(uVar13 + (long)pKey1),&local_9c);
              uVar12 = local_9c;
            }
            uVar16 = 0xffffffff;
            if ((uVar12 < 0xc) || ((uVar12 & 1) != 0)) goto LAB_00177c68;
            uVar4 = uVar12 - 0xc >> 1;
            if ((uint)nKey1 < uVar4 + uVar19) {
              uVar9 = 0x13bd1;
LAB_00177cb8:
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar9,
                          "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
              *local_90 = '\v';
              return 0;
            }
            if ((pMem2->flags & 0x4000) == 0) {
              uVar16 = pMem2->n;
              uVar17 = uVar4 - uVar16;
              if ((int)uVar4 < (int)uVar16) {
                uVar16 = uVar4;
              }
LAB_00177b5d:
              uVar16 = memcmp((void *)(uVar10 + (long)pKey1),pMem2->z,(long)(int)uVar16);
              if (uVar16 != 0) goto LAB_00177c68;
            }
            else {
              if (uVar12 - 0xc != 0) {
                uVar14 = 0;
                do {
                  if (*(char *)((long)pKey1 + uVar14 + uVar10) != '\0') goto LAB_00177c32;
                  uVar14 = uVar14 + 1;
                } while (uVar4 != uVar14);
              }
              uVar17 = uVar4 - (pMem2->u).nZero;
            }
          }
        }
        else {
          uVar12 = (int)*(char *)((long)pKey1 + uVar13);
          if (*(char *)((long)pKey1 + uVar13) < '\0') {
            sqlite3GetVarint32((uchar *)(uVar13 + (long)pKey1),&local_9c);
            uVar12 = local_9c;
          }
          if (uVar12 < 0xc) {
            uVar16 = 0xffffffff;
            goto LAB_00177c68;
          }
          if ((uVar12 & 1) == 0) {
LAB_00177c32:
            uVar16 = 1;
            goto LAB_00177c68;
          }
          local_5c = uVar12 - 0xc >> 1;
          if (((uint)nKey1 < local_5c + uVar19) ||
             (pKVar3 = local_98->pKeyInfo, pKVar3->nAllField <= uVar11)) {
            uVar9 = 0x13bb3;
            goto LAB_00177cb8;
          }
          if (pKVar3->aColl[uVar11] == (CollSeq *)0x0) {
            uVar16 = pMem2->n;
            uVar17 = local_5c - uVar16;
            if ((int)local_5c < (int)uVar16) {
              uVar16 = local_5c;
            }
            goto LAB_00177b5d;
          }
          local_5e = pKVar3->enc;
          local_40 = pKVar3->db;
          local_60 = 2;
          local_58 = uVar10 + (long)pKey1;
          uVar17 = vdbeCompareMemString((Mem *)&local_68,pMem2,pKVar3->aColl[uVar11],local_90);
        }
LAB_00177b7b:
        uVar16 = uVar17;
        if (uVar16 != 0) goto LAB_00177c68;
      }
      else {
        bVar6 = *(byte *)((long)pKey1 + uVar13);
        uVar12 = (uint)bVar6;
        uVar16 = 1;
        if (9 < bVar6) goto LAB_00177c68;
        uVar16 = 0xffffffff;
        if (bVar6 == 0) goto LAB_00177c68;
        sqlite3VdbeSerialGet((uchar *)(uVar10 + (long)pKey1),(uint)bVar6,(Mem *)&local_68);
        dVar1 = (pMem2->u).r;
        if (bVar6 != 7) {
          if ((double)CONCAT44(local_68.i._4_4_,local_68.nZero) < dVar1) goto LAB_00177c68;
          uVar17 = (uint)(dVar1 < (double)CONCAT44(local_68.i._4_4_,local_68.nZero));
          local_88 = dVar1;
          goto LAB_00177b7b;
        }
        if ((double)CONCAT44(local_68.i._4_4_,local_68.nZero) < dVar1) goto LAB_00177c68;
        uVar12 = 7;
        uVar16 = 1;
        if (dVar1 < (double)CONCAT44(local_68.i._4_4_,local_68.nZero)) goto LAB_00177c68;
      }
      goto LAB_00177b84;
    }
    bVar6 = *(byte *)((long)pKey1 + uVar13);
    uVar12 = (uint)bVar6;
    uVar16 = 1;
    if (9 < bVar6) goto LAB_00177c68;
    if (bVar6 == 7) {
      uVar12 = 7;
      sqlite3VdbeSerialGet((uchar *)(uVar10 + (long)pKey1),7,(Mem *)&local_68);
      local_78 = (pMem2->u).i;
      uVar16 = 1;
      if ((double)local_78 < (double)CONCAT44(local_68.i._4_4_,local_68.nZero)) goto LAB_00177c68;
      uVar17 = -(uint)((double)CONCAT44(local_68.i._4_4_,local_68.nZero) < (double)local_78);
      goto LAB_00177b7b;
    }
    uVar16 = 0xffffffff;
    if (bVar6 == 0) goto LAB_00177c68;
    switch(bVar6) {
    case 1:
      uVar14 = (ulong)*(char *)((long)pKey1 + uVar10);
      break;
    case 2:
      uVar8 = (long)*(char *)((long)pKey1 + uVar10) << 8;
      uVar14 = (ulong)*(byte *)((long)pKey1 + uVar10 + 1);
      goto LAB_00177b21;
    case 3:
      uVar14 = (ulong)*(byte *)((long)pKey1 + uVar10 + 1) << 8 |
               (long)*(char *)((long)pKey1 + uVar10) << 0x10;
      bVar6 = *(byte *)((long)pKey1 + uVar10 + 2);
      goto LAB_00177b0e;
    case 4:
      uVar14 = (ulong)*(byte *)((long)pKey1 + uVar10 + 2) << 8 |
               (long)(int)((uint)*(byte *)((long)pKey1 + uVar10) << 0x18) |
               (ulong)*(byte *)((long)pKey1 + uVar10 + 1) << 0x10;
      bVar6 = *(byte *)((long)pKey1 + uVar10 + 3);
LAB_00177b0e:
      uVar14 = bVar6 | uVar14;
      break;
    case 5:
      uVar17 = *(uint *)((long)pKey1 + uVar10 + 2);
      uVar8 = (ulong)(uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                     uVar17 << 0x18);
      uVar14 = (ulong)(uint)(int)CONCAT11(*(undefined1 *)((long)pKey1 + uVar10),
                                          *(undefined1 *)((long)pKey1 + uVar10 + 1)) << 0x20;
LAB_00177b21:
      uVar14 = uVar14 | uVar8;
      break;
    case 6:
      uVar10 = *(ulong *)((long)pKey1 + uVar10);
      uVar14 = uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
               (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
               (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 | (uVar10 & 0xff00) << 0x28
               | uVar10 << 0x38;
      break;
    default:
      uVar14 = (ulong)(uVar12 - 8);
    }
    if (((long)uVar14 < (pMem2->u).i) || (uVar16 = 1, (pMem2->u).i < (long)uVar14)) {
LAB_00177c68:
      if (local_98->pKeyInfo->aSortOrder[uVar11 & 0xffffffff] != '\0') {
        return -uVar16;
      }
      return uVar16;
    }
LAB_00177b84:
    uVar11 = uVar11 + 1;
    if (uVar11 == local_98->nField) {
LAB_00177c23:
      local_98->eqSeen = '\x01';
      return (int)local_98->default_rc;
    }
    if (uVar12 < 0x80) {
      uVar16 = (uint)""[uVar12];
      iVar7 = 1;
    }
    else {
      uVar16 = uVar12 - 0xc >> 1;
      iVar7 = 1;
      uVar10 = (ulong)uVar12;
      do {
        iVar7 = iVar7 + 1;
        bVar20 = 0x3fff < uVar10;
        uVar10 = uVar10 >> 7;
      } while (bVar20);
    }
    uVar19 = uVar19 + uVar16;
    uVar12 = (int)uVar13 + iVar7;
    uVar13 = (ulong)uVar12;
    if ((uVar15 <= uVar12) || (pMem2 = pMem2 + 1, (uint)nKey1 < uVar19)) goto LAB_00177c23;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeRecordCompareWithSkip(
  int nKey1, const void *pKey1,   /* Left key */
  UnpackedRecord *pPKey2,         /* Right key */
  int bSkip                       /* If true, skip the first field */
){
  u32 d1;                         /* Offset into aKey[] of next data element */
  int i;                          /* Index of next field to compare */
  u32 szHdr1;                     /* Size of record header in bytes */
  u32 idx1;                       /* Offset of first type in header */
  int rc = 0;                     /* Return value */
  Mem *pRhs = pPKey2->aMem;       /* Next field of pPKey2 to compare */
  KeyInfo *pKeyInfo;
  const unsigned char *aKey1 = (const unsigned char *)pKey1;
  Mem mem1;

  /* If bSkip is true, then the caller has already determined that the first
  ** two elements in the keys are equal. Fix the various stack variables so
  ** that this routine begins comparing at the second field. */
  if( bSkip ){
    u32 s1;
    idx1 = 1 + getVarint32(&aKey1[1], s1);
    szHdr1 = aKey1[0];
    d1 = szHdr1 + sqlite3VdbeSerialTypeLen(s1);
    i = 1;
    pRhs++;
  }else{
    idx1 = getVarint32(aKey1, szHdr1);
    d1 = szHdr1;
    i = 0;
  }
  if( d1>(unsigned)nKey1 ){ 
    pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
    return 0;  /* Corruption */
  }

  VVA_ONLY( mem1.szMalloc = 0; ) /* Only needed by assert() statements */
  assert( pPKey2->pKeyInfo->nAllField>=pPKey2->nField 
       || CORRUPT_DB );
  assert( pPKey2->pKeyInfo->aSortOrder!=0 );
  assert( pPKey2->pKeyInfo->nKeyField>0 );
  assert( idx1<=szHdr1 || CORRUPT_DB );
  do{
    u32 serial_type;

    /* RHS is an integer */
    if( pRhs->flags & (MEM_Int|MEM_IntReal) ){
      testcase( pRhs->flags & MEM_Int );
      testcase( pRhs->flags & MEM_IntReal );
      serial_type = aKey1[idx1];
      testcase( serial_type==12 );
      if( serial_type>=10 ){
        rc = +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else if( serial_type==7 ){
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        rc = -sqlite3IntFloatCompare(pRhs->u.i, mem1.u.r);
      }else{
        i64 lhs = vdbeRecordDecodeInt(serial_type, &aKey1[d1]);
        i64 rhs = pRhs->u.i;
        if( lhs<rhs ){
          rc = -1;
        }else if( lhs>rhs ){
          rc = +1;
        }
      }
    }

    /* RHS is real */
    else if( pRhs->flags & MEM_Real ){
      serial_type = aKey1[idx1];
      if( serial_type>=10 ){
        /* Serial types 12 or greater are strings and blobs (greater than
        ** numbers). Types 10 and 11 are currently "reserved for future 
        ** use", so it doesn't really matter what the results of comparing
        ** them to numberic values are.  */
        rc = +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else{
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        if( serial_type==7 ){
          if( mem1.u.r<pRhs->u.r ){
            rc = -1;
          }else if( mem1.u.r>pRhs->u.r ){
            rc = +1;
          }
        }else{
          rc = sqlite3IntFloatCompare(mem1.u.i, pRhs->u.r);
        }
      }
    }

    /* RHS is a string */
    else if( pRhs->flags & MEM_Str ){
      getVarint32(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 ){
        rc = -1;
      }else if( !(serial_type & 0x01) ){
        rc = +1;
      }else{
        mem1.n = (serial_type - 12) / 2;
        testcase( (d1+mem1.n)==(unsigned)nKey1 );
        testcase( (d1+mem1.n+1)==(unsigned)nKey1 );
        if( (d1+mem1.n) > (unsigned)nKey1
         || (pKeyInfo = pPKey2->pKeyInfo)->nAllField<=i
        ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pKeyInfo->aColl[i] ){
          mem1.enc = pKeyInfo->enc;
          mem1.db = pKeyInfo->db;
          mem1.flags = MEM_Str;
          mem1.z = (char*)&aKey1[d1];
          rc = vdbeCompareMemString(
              &mem1, pRhs, pKeyInfo->aColl[i], &pPKey2->errCode
          );
        }else{
          int nCmp = MIN(mem1.n, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = mem1.n - pRhs->n; 
        }
      }
    }

    /* RHS is a blob */
    else if( pRhs->flags & MEM_Blob ){
      assert( (pRhs->flags & MEM_Zero)==0 || pRhs->n==0 );
      getVarint32(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 || (serial_type & 0x01) ){
        rc = -1;
      }else{
        int nStr = (serial_type - 12) / 2;
        testcase( (d1+nStr)==(unsigned)nKey1 );
        testcase( (d1+nStr+1)==(unsigned)nKey1 );
        if( (d1+nStr) > (unsigned)nKey1 ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pRhs->flags & MEM_Zero ){
          if( !isAllZero((const char*)&aKey1[d1],nStr) ){
            rc = 1;
          }else{
            rc = nStr - pRhs->u.nZero;
          }
        }else{
          int nCmp = MIN(nStr, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = nStr - pRhs->n;
        }
      }
    }

    /* RHS is null */
    else{
      serial_type = aKey1[idx1];
      rc = (serial_type!=0);
    }

    if( rc!=0 ){
      if( pPKey2->pKeyInfo->aSortOrder[i] ){
        rc = -rc;
      }
      assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, rc) );
      assert( mem1.szMalloc==0 );  /* See comment below */
      return rc;
    }

    i++;
    if( i==pPKey2->nField ) break;
    pRhs++;
    d1 += sqlite3VdbeSerialTypeLen(serial_type);
    idx1 += sqlite3VarintLen(serial_type);
  }while( idx1<(unsigned)szHdr1 && d1<=(unsigned)nKey1 );

  /* No memory allocation is ever used on mem1.  Prove this using
  ** the following assert().  If the assert() fails, it indicates a
  ** memory leak and a need to call sqlite3VdbeMemRelease(&mem1).  */
  assert( mem1.szMalloc==0 );

  /* rc==0 here means that one or both of the keys ran out of fields and
  ** all the fields up to that point were equal. Return the default_rc
  ** value.  */
  assert( CORRUPT_DB 
       || vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, pPKey2->default_rc) 
       || pPKey2->pKeyInfo->db->mallocFailed
  );
  pPKey2->eqSeen = 1;
  return pPKey2->default_rc;
}